

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O1

int __thiscall DIS::AcousticEmitterSystemData::getMarshalledSize(AcousticEmitterSystemData *this)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pAVar4;
  ulong uVar5;
  long lVar6;
  AcousticBeamData listElement;
  AcousticBeamData local_60;
  
  iVar2 = AcousticEmitterSystem::getMarshalledSize(&this->_acousticEmitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_emitterLocation);
  iVar2 = iVar2 + iVar3 + 4;
  pAVar4 = (this->_beamRecords).
           super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->_beamRecords).
      super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar4) {
    lVar6 = 0x18;
    uVar5 = 0;
    do {
      local_60._vptr_AcousticBeamData = (_func_int **)&PTR__AcousticBeamData_0019f090;
      local_60._8_4_ = *(undefined4 *)((long)pAVar4 + lVar6 + -0x10);
      local_60._fundamentalDataParameters._vptr_AcousticBeamFundamentalParameter =
           (_func_int **)&PTR__AcousticBeamFundamentalParameter_0019f0d8;
      local_60._fundamentalDataParameters._deBeamwidth =
           *(float *)((long)&(pAVar4->_fundamentalDataParameters).
                             _vptr_AcousticBeamFundamentalParameter + lVar6);
      puVar1 = (undefined8 *)((long)&pAVar4->_vptr_AcousticBeamData + lVar6);
      local_60._fundamentalDataParameters._8_8_ = *puVar1;
      local_60._fundamentalDataParameters._16_8_ = puVar1[1];
      iVar3 = AcousticBeamData::getMarshalledSize(&local_60);
      iVar2 = iVar2 + iVar3;
      AcousticBeamData::~AcousticBeamData(&local_60);
      uVar5 = uVar5 + 1;
      pAVar4 = (this->_beamRecords).
               super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x30;
    } while (uVar5 < (ulong)(((long)(this->_beamRecords).
                                    super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 4)
                            * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int AcousticEmitterSystemData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _emitterSystemDataLength
   marshalSize = marshalSize + 1;  // _numberOfBeams
   marshalSize = marshalSize + 2;  // _pad2
   marshalSize = marshalSize + _acousticEmitterSystem.getMarshalledSize();  // _acousticEmitterSystem
   marshalSize = marshalSize + _emitterLocation.getMarshalledSize();  // _emitterLocation

   for(unsigned long long idx=0; idx < _beamRecords.size(); idx++)
   {
        AcousticBeamData listElement = _beamRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}